

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error ps_parser_load_field_table
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte *pFVar1;
  undefined1 local_388 [8];
  T1_FieldRec fieldrec;
  FT_Byte *old_limit;
  FT_Byte *old_cursor;
  FT_Error error;
  FT_Int num_elements;
  T1_Token token;
  T1_TokenRec elements [32];
  FT_ULong *pflags_local;
  FT_UInt max_objects_local;
  void **objects_local;
  T1_Field field_local;
  PS_Parser parser_local;
  
  old_cursor._0_4_ = 0;
  memcpy(local_388,field,0x30);
  fieldrec.ident._4_4_ = 2;
  if ((field->type == T1_FIELD_TYPE_FIXED_ARRAY) || (field->type == T1_FIELD_TYPE_BBOX)) {
    fieldrec.ident._4_4_ = 3;
  }
  ps_parser_to_token_array(parser,(T1_Token)&token,0x20,(FT_Int *)((long)&old_cursor + 4));
  if ((int)old_cursor._4_4_ < 0) {
    old_cursor._0_4_ = 0xa2;
  }
  else {
    if (field->array_max < old_cursor._4_4_) {
      old_cursor._4_4_ = field->array_max;
    }
    pFVar1 = parser->cursor;
    fieldrec._40_8_ = parser->limit;
    if ((field->type != T1_FIELD_TYPE_BBOX) && (field->count_offset != 0)) {
      *(char *)((long)*objects + (ulong)field->count_offset) = (char)old_cursor._4_4_;
    }
    _error = &token;
    for (; 0 < (int)old_cursor._4_4_; old_cursor._4_4_ = old_cursor._4_4_ - 1) {
      parser->cursor = (FT_Byte *)*_error;
      parser->limit = (FT_Byte *)_error[1];
      old_cursor._0_4_ =
           ps_parser_load_field(parser,(T1_Field)local_388,objects,max_objects,(FT_ULong *)0x0);
      if ((FT_Error)old_cursor != 0) break;
      fieldrec.reader._0_4_ = (uint)fieldrec.reader._4_1_ + (int)fieldrec.reader;
      _error = _error + 3;
    }
    parser->cursor = pFVar1;
    parser->limit = (FT_Byte *)fieldrec._40_8_;
  }
  return (FT_Error)old_cursor;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field_table( PS_Parser       parser,
                              const T1_Field  field,
                              void**          objects,
                              FT_UInt         max_objects,
                              FT_ULong*       pflags )
  {
    T1_TokenRec  elements[T1_MAX_TABLE_ELEMENTS];
    T1_Token     token;
    FT_Int       num_elements;
    FT_Error     error = FT_Err_Ok;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;
    T1_FieldRec  fieldrec = *(T1_Field)field;


    fieldrec.type = T1_FIELD_TYPE_INTEGER;
    if ( field->type == T1_FIELD_TYPE_FIXED_ARRAY ||
         field->type == T1_FIELD_TYPE_BBOX        )
      fieldrec.type = T1_FIELD_TYPE_FIXED;

    ps_parser_to_token_array( parser, elements,
                              T1_MAX_TABLE_ELEMENTS, &num_elements );
    if ( num_elements < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( (FT_UInt)num_elements > field->array_max )
      num_elements = (FT_Int)field->array_max;

    old_cursor = parser->cursor;
    old_limit  = parser->limit;

    /* we store the elements count if necessary;           */
    /* we further assume that `count_offset' can't be zero */
    if ( field->type != T1_FIELD_TYPE_BBOX && field->count_offset != 0 )
      *(FT_Byte*)( (FT_Byte*)objects[0] + field->count_offset ) =
        (FT_Byte)num_elements;

    /* we now load each element, adjusting the field.offset on each one */
    token = elements;
    for ( ; num_elements > 0; num_elements--, token++ )
    {
      parser->cursor = token->start;
      parser->limit  = token->limit;

      error = ps_parser_load_field( parser,
                                    &fieldrec,
                                    objects,
                                    max_objects,
                                    0 );
      if ( error )
        break;

      fieldrec.offset += fieldrec.size;
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    parser->cursor = old_cursor;
    parser->limit  = old_limit;

  Exit:
    return error;
  }